

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<char_*,_10>::TPZManVector
          (TPZManVector<char_*,_10> *this,initializer_list<char_*> *list)

{
  size_type sVar1;
  iterator ppcVar2;
  char **ppcVar3;
  int64_t iVar4;
  long lVar5;
  
  (this->super_TPZVec<char_*>).fStore = (char **)0x0;
  (this->super_TPZVec<char_*>).fNElements = 0;
  (this->super_TPZVec<char_*>).fNAlloc = 0;
  (this->super_TPZVec<char_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841be0;
  sVar1 = list->_M_len;
  lVar5 = (long)(int)sVar1;
  if (lVar5 < 0xb) {
    ppcVar3 = this->fExtAlloc;
    iVar4 = 0;
  }
  else {
    ppcVar3 = (char **)operator_new__((long)(sVar1 << 0x20) >> 0x1d);
    iVar4 = lVar5;
  }
  (this->super_TPZVec<char_*>).fStore = ppcVar3;
  (this->super_TPZVec<char_*>).fNElements = lVar5;
  (this->super_TPZVec<char_*>).fNAlloc = iVar4;
  if (sVar1 != 0) {
    ppcVar2 = list->_M_array;
    ppcVar3 = (this->super_TPZVec<char_*>).fStore;
    lVar5 = 0;
    do {
      *(undefined8 *)((long)ppcVar3 + lVar5) = *(undefined8 *)((long)ppcVar2 + lVar5);
      lVar5 = lVar5 + 8;
    } while (sVar1 << 3 != lVar5);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const std::initializer_list<T>& list)
{
	int size = list.size();
//	std::cout << "init pzmanvec" << std::endl;
	if (size <= (int64_t)(sizeof(fExtAlloc) / sizeof(T))) {
		// Needed to make TPZVec::operator[] work properly.
		this->fStore = fExtAlloc;
		this->fNElements = size;
		// No memory was allocated by the constructor.
		this->fNAlloc = 0;
	}
	else // The size requested is bigger than the size already provided.
	{
		// Executes the allocation that would be done by TPZVec<T>(size).
		this->fStore = new T[size];
		this->fNElements = size;
		this->fNAlloc = size;
	}

	auto it_end = list.end();
	T* aux = this->fStore;
	for (auto it = list.begin(); it != it_end; it++, aux++)
		*aux = *it;
}